

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::FeatureType::FeatureType(FeatureType *this,FeatureType *from)

{
  void *pvVar1;
  Int64FeatureType *this_00;
  ArrayFeatureType *this_01;
  StringFeatureType *this_02;
  ImageFeatureType *this_03;
  DoubleFeatureType *this_04;
  DictionaryFeatureType *this_05;
  SequenceFeatureType *this_06;
  ArrayFeatureType *from_00;
  StringFeatureType *from_01;
  ImageFeatureType *from_02;
  Int64FeatureType *from_03;
  DoubleFeatureType *from_04;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *from_06;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureType_00426b00;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->isoptional_ = from->isoptional_;
  this->_oneof_case_[0] = 0;
  switch(from->_oneof_case_[0]) {
  case 1:
    clear_Type(this);
    this->_oneof_case_[0] = 1;
    this_00 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_00);
    (this->Type_).int64type_ = this_00;
    if (from->_oneof_case_[0] == 1) {
      from_03 = (from->Type_).int64type_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_03 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
    }
    Int64FeatureType::MergeFrom(this_00,from_03);
    break;
  case 2:
    clear_Type(this);
    this->_oneof_case_[0] = 2;
    this_04 = (DoubleFeatureType *)operator_new(0x18);
    DoubleFeatureType::DoubleFeatureType(this_04);
    (this->Type_).doubletype_ = this_04;
    if (from->_oneof_case_[0] == 2) {
      from_04 = (from->Type_).doubletype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_04 = (DoubleFeatureType *)&_DoubleFeatureType_default_instance_;
    }
    DoubleFeatureType::MergeFrom(this_04,from_04);
    break;
  case 3:
    clear_Type(this);
    this->_oneof_case_[0] = 3;
    this_02 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_02);
    (this->Type_).stringtype_ = this_02;
    if (from->_oneof_case_[0] == 3) {
      from_01 = (from->Type_).stringtype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (StringFeatureType *)&_StringFeatureType_default_instance_;
    }
    StringFeatureType::MergeFrom(this_02,from_01);
    break;
  case 4:
    clear_Type(this);
    this->_oneof_case_[0] = 4;
    this_03 = (ImageFeatureType *)operator_new(0x38);
    ImageFeatureType::ImageFeatureType(this_03);
    (this->Type_).imagetype_ = this_03;
    if (from->_oneof_case_[0] == 4) {
      from_02 = (from->Type_).imagetype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_02 = (ImageFeatureType *)&_ImageFeatureType_default_instance_;
    }
    ImageFeatureType::MergeFrom(this_03,from_02);
    break;
  case 5:
    clear_Type(this);
    this->_oneof_case_[0] = 5;
    this_01 = (ArrayFeatureType *)operator_new(0x48);
    ArrayFeatureType::ArrayFeatureType(this_01);
    (this->Type_).multiarraytype_ = this_01;
    if (from->_oneof_case_[0] == 5) {
      from_00 = (from->Type_).multiarraytype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (ArrayFeatureType *)&_ArrayFeatureType_default_instance_;
    }
    ArrayFeatureType::MergeFrom(this_01,from_00);
    break;
  case 6:
    clear_Type(this);
    this->_oneof_case_[0] = 6;
    this_05 = (DictionaryFeatureType *)operator_new(0x20);
    DictionaryFeatureType::DictionaryFeatureType(this_05);
    (this->Type_).dictionarytype_ = this_05;
    if (from->_oneof_case_[0] == 6) {
      from_05 = (from->Type_).dictionarytype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_05 = (DictionaryFeatureType *)&_DictionaryFeatureType_default_instance_;
    }
    DictionaryFeatureType::MergeFrom(this_05,from_05);
    break;
  case 7:
    clear_Type(this);
    this->_oneof_case_[0] = 7;
    this_06 = (SequenceFeatureType *)operator_new(0x28);
    SequenceFeatureType::SequenceFeatureType(this_06);
    (this->Type_).sequencetype_ = this_06;
    if (from->_oneof_case_[0] == 7) {
      from_06 = (from->Type_).sequencetype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_06 = (SequenceFeatureType *)&_SequenceFeatureType_default_instance_;
    }
    SequenceFeatureType::MergeFrom(this_06,from_06);
  }
  return;
}

Assistant:

FeatureType::FeatureType(const FeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  isoptional_ = from.isoptional_;
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FeatureType)
}